

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_equality_expr(lyxp_expr *exp,uint16_t *exp_idx,uint16_t repeat,lyd_node *cur_node,
                      lys_module *param_5,lyxp_set *set,int options)

{
  ushort uVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  ushort local_ca;
  undefined1 local_c8 [6];
  uint16_t i;
  lyxp_set set2;
  lyxp_set orig_set;
  uint16_t this_op;
  int ret;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t repeat_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if (repeat == 0) {
    __assert_fail("repeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x1fc0,
                  "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                 );
  }
  memset(&set2.field_0x38,0,0x40);
  memset(local_c8,0,0x40);
  set_fill_set((lyxp_set *)&set2.field_0x38,set);
  orig_set._60_4_ = eval_expr_select(exp,exp_idx,LYXP_EXPR_EQUALITY,cur_node,param_5,set,options);
  if (orig_set._60_4_ == 0) {
    for (local_ca = 0; local_ca < repeat; local_ca = local_ca + 1) {
      uVar1 = *exp_idx;
      if (exp->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_COMP) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1fd0,
                      "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      pcVar4 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar4 = "parsed";
      }
      pcVar5 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_equality_expr",pcVar4,pcVar5);
      *exp_idx = *exp_idx + 1;
      if (set == (lyxp_set *)0x0) {
        orig_set._60_4_ =
             eval_expr_select(exp,exp_idx,LYXP_EXPR_EQUALITY,cur_node,param_5,(lyxp_set *)0x0,
                              options);
        if (orig_set._60_4_ != 0) {
          return orig_set._60_4_;
        }
      }
      else {
        set_fill_set((lyxp_set *)local_c8,(lyxp_set *)&set2.field_0x38);
        orig_set._60_4_ =
             eval_expr_select(exp,exp_idx,LYXP_EXPR_EQUALITY,cur_node,param_5,(lyxp_set *)local_c8,
                              options);
        if (orig_set._60_4_ != 0) break;
        if ((options & 0x1cU) == 0) {
          if ((((set->type == LYXP_SET_NODE_SET) &&
               ((((set->val).nodes)->node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) !=
                LYS_UNKNOWN)) && (*(int *)&((set->val).nodes)->node->schema[1].ref == 7)) &&
             ((local_c8._0_4_ == LYXP_SET_STRING &&
              (pcVar4 = strchr((char *)set2._8_8_,0x3a), uVar2 = set2._8_8_, pcVar4 == (char *)0x0))
             )) {
            sVar6 = strlen(param_5->name);
            sVar7 = strlen((char *)set2._8_8_);
            pvVar8 = ly_realloc((void *)uVar2,sVar6 + sVar7 + 2);
            set2._8_8_ = pvVar8;
            if (pvVar8 == (void *)0x0) break;
            sVar6 = strlen(param_5->name);
            uVar2 = set2._8_8_;
            sVar7 = strlen((char *)set2._8_8_);
            memmove((void *)((long)pvVar8 + sVar6 + 1),(void *)uVar2,sVar7 + 1);
            uVar2 = set2._8_8_;
            pcVar4 = param_5->name;
            sVar6 = strlen(param_5->name);
            memcpy((void *)uVar2,pcVar4,sVar6);
            uVar2 = set2._8_8_;
            sVar6 = strlen(param_5->name);
            *(undefined1 *)(uVar2 + sVar6) = 0x3a;
          }
          iVar3 = moveto_op_comp(set,(lyxp_set *)local_c8,exp->expr + exp->expr_pos[uVar1],cur_node,
                                 param_5,options);
          if (iVar3 != 0) {
            orig_set._60_4_ = 0xffffffff;
            break;
          }
        }
        else {
          warn_operands(param_5->ctx,set,(lyxp_set *)local_c8,0,exp->expr,
                        exp->expr_pos[(int)(uVar1 - 1)]);
          warn_equality_value(param_5->ctx,exp,set,*exp_idx - 1,uVar1 - 1,*exp_idx - 1);
          warn_equality_value(param_5->ctx,exp,(lyxp_set *)local_c8,uVar1 - 1,uVar1 - 1,*exp_idx - 1
                             );
          set_snode_merge(set,(lyxp_set *)local_c8);
          set_snode_clear_ctx(set);
        }
      }
    }
  }
  lyxp_set_cast((lyxp_set *)&set2.field_0x38,LYXP_SET_EMPTY,cur_node,param_5,options);
  lyxp_set_cast((lyxp_set *)local_c8,LYXP_SET_EMPTY,cur_node,param_5,options);
  return orig_set._60_4_;
}

Assistant:

static int
eval_equality_expr(struct lyxp_expr *exp, uint16_t *exp_idx, uint16_t repeat, struct lyd_node *cur_node,
                   struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op;
    struct lyxp_set orig_set, set2;
    uint16_t i;

    assert(repeat);

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    set_fill_set(&orig_set, set);

    ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_EQUALITY, cur_node, local_mod, set, options);
    if (ret) {
        goto finish;
    }

    /* ('=' / '!=' RelationalExpr)* */
    for (i = 0; i < repeat; ++i) {
        this_op = *exp_idx;

        assert(exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP);
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        if (!set) {
            ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_EQUALITY, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_expr_select(exp, exp_idx, LYXP_EXPR_EQUALITY, cur_node, local_mod, &set2, options);
        if (ret) {
            goto finish;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            warn_operands(local_mod->ctx, set, &set2, 0, exp->expr, exp->expr_pos[this_op - 1]);
            warn_equality_value(local_mod->ctx, exp, set, *exp_idx - 1, this_op - 1, *exp_idx - 1);
            warn_equality_value(local_mod->ctx, exp, &set2, this_op - 1, this_op - 1, *exp_idx - 1);
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            /* special handling of evaluations of identityref comparisons, always compare prefixed identites */
            if ((set->type == LYXP_SET_NODE_SET) && (set->val.nodes[0].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                    && (((struct lys_node_leaf *)set->val.nodes[0].node->schema)->type.base == LY_TYPE_IDENT)) {
                /* left operand is identityref */
                if ((set2.type == LYXP_SET_STRING) && !strchr(set2.val.str, ':')) {
                    /* missing prefix in the right operand */
                    set2.val.str = ly_realloc(set2.val.str, strlen(local_mod->name) + 1 + strlen(set2.val.str) + 1);
                    if (!set2.val.str) {
                        goto finish;
                    }

                    memmove(set2.val.str + strlen(local_mod->name) + 1, set2.val.str, strlen(set2.val.str) + 1);
                    memcpy(set2.val.str, local_mod->name, strlen(local_mod->name));
                    set2.val.str[strlen(local_mod->name)] = ':';
                }
            }

            if (moveto_op_comp(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                ret = -1;
                goto finish;
            }
        }
    }

finish:
    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return ret;
}